

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void ReadArrayVars(PNGHandle *png,FWorldGlobalArray *vars,size_t count,DWORD id)

{
  uint uVar1;
  uint uVar2;
  DWORD DVar3;
  DWORD DVar4;
  DWORD DVar5;
  DWORD key;
  TMap<int,_int,_THashTraits<int>,_InitIntToZero> *this;
  bool bVar6;
  SDWORD val;
  PNGHandle *local_340;
  FWorldGlobalArray *local_338;
  FPNGChunkArchive arc;
  
  local_340 = png;
  uVar1 = M_FindPNGChunk(png,id);
  for (uVar2 = 0; uVar2 < count; uVar2 = uVar2 + 1) {
    TMap<int,_int,_THashTraits<int>,_InitIntToZero>::Clear(vars + uVar2,1);
  }
  if (uVar1 != 0) {
    local_338 = vars;
    FPNGChunkArchive::FPNGChunkArchive(&arc,local_340->File->File,id,(ulong)uVar1);
    DVar3 = FArchive::ReadCount(&arc.super_FArchive);
    DVar4 = FArchive::ReadCount(&arc.super_FArchive);
    for (; DVar3 <= DVar4; DVar3 = DVar3 + 1) {
      DVar5 = FArchive::ReadCount(&arc.super_FArchive);
      this = local_338 + DVar3;
      while (bVar6 = DVar5 != 0, DVar5 = DVar5 - 1, bVar6) {
        key = FArchive::ReadCount(&arc.super_FArchive);
        val = FArchive::ReadCount(&arc.super_FArchive);
        TMap<int,_int,_THashTraits<int>,_InitIntToZero>::Insert(this,key,&val);
      }
    }
    FileReader::ResetFilePtr(local_340->File);
    FPNGChunkArchive::~FPNGChunkArchive(&arc);
  }
  return;
}

Assistant:

static void ReadArrayVars (PNGHandle *png, FWorldGlobalArray *vars, size_t count, DWORD id)
{
	size_t len = M_FindPNGChunk (png, id);
	unsigned int i, k;

	for (i = 0; i < count; ++i)
	{
		vars[i].Clear ();
	}

	if (len != 0)
	{
		DWORD max, size;
		FPNGChunkArchive arc (png->File->GetFile(), id, len);

		i = arc.ReadCount ();
		max = arc.ReadCount ();

		for (; i <= max; ++i)
		{
			size = arc.ReadCount ();
			for (k = 0; k < size; ++k)
			{
				SDWORD key, val;
				key = arc.ReadCount();

				val = arc.ReadCount();
				vars[i].Insert (key, val);
			}
		}
		png->File->ResetFilePtr();
	}
}